

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void mips_tr_translate_insn(DisasContextBase *dcbase,CPUState *cs)

{
  DisasJumpType DVar1;
  CPUArchState_conflict14 *env;
  uc_struct_conflict7 *val;
  TCGContext_conflict6 *pTVar2;
  void *pvVar3;
  hook *phVar4;
  bool bVar5;
  byte rt;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int32_t offset;
  uintptr_t o_3;
  undefined1 *puVar10;
  list_item *plVar11;
  TCGv_i32 pTVar12;
  TCGv_i64 pTVar13;
  TCGv_i64 pTVar14;
  TCGLabel *l;
  byte count;
  uint uVar15;
  target_ulong uimm;
  TCGArg a2;
  anon_union_16_2_88bb8dd4_for_ops_free_ops *paVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uintptr_t o_9;
  ushort uVar21;
  target_ulong tVar22;
  char cVar23;
  ulong uVar24;
  TCGOpcode opc;
  TCGContext_conflict6 *pTVar25;
  DisasContext_conflict6 *pDVar26;
  ushort imm;
  int iVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uintptr_t o_21;
  ulong uVar31;
  int16_t iVar32;
  uintptr_t o;
  TCGTemp *pTVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  uintptr_t o_1;
  TCGTemp *pTVar37;
  int iVar38;
  uintptr_t o_2;
  TCGTemp *ts;
  TCGTemp *args [1];
  int local_84;
  void *local_80;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  env = (CPUArchState_conflict14 *)cs->env_ptr;
  val = cs->uc;
  pTVar2 = val->tcg_ctx;
  uVar34 = (uint)dcbase[2].pc_next & 0x87f800;
  local_78 = (TCGTemp *)dcbase->pc_next;
  if (val->use_exits == 0) {
    if ((TCGTemp *)val->exits[(long)val->nested_level + -1] == local_78) goto LAB_00978d78;
  }
  else {
    puVar10 = (undefined1 *)g_tree_lookup(val->ctl_exits,&local_78);
    if (puVar10 == &DAT_00000001) {
LAB_00978d78:
      local_78 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
      tcg_gen_callN_mips64el(pTVar2,helper_wait_mips64el,(TCGTemp *)0x0,1,&local_78);
      dcbase->is_jmp = DISAS_NORETURN;
      return;
    }
  }
  plVar11 = val->hook[2].head;
  if (plVar11 != (list_item *)0x0) {
    uVar24 = dcbase->pc_next;
LAB_00978d1a:
    pvVar3 = plVar11->data;
    if ((*(ulong *)((long)pvVar3 + 0x18) <= *(ulong *)((long)pvVar3 + 0x20) &&
         (*(ulong *)((long)pvVar3 + 0x20) < uVar24 || uVar24 < *(ulong *)((long)pvVar3 + 0x18))) ||
       (*(char *)((long)pvVar3 + 0x14) == '\x01')) goto LAB_00978d4d;
    tcg_gen_op2_mips64el(pTVar2,INDEX_op_movi_i64,(TCGArg)(pTVar2->cpu_pc + (long)pTVar2),uVar24);
    local_80 = ((pTVar2->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
    tVar22 = dcbase->pc_next;
    pTVar12 = tcg_const_i32_mips64el(pTVar2,4);
    pTVar14 = tcg_const_i64_mips64el(pTVar2,(int64_t)val);
    pTVar13 = tcg_const_i64_mips64el(pTVar2,tVar22);
    pTVar33 = (TCGTemp *)(pTVar14 + (long)pTVar2);
    pTVar37 = (TCGTemp *)(pTVar13 + (long)pTVar2);
    ts = (TCGTemp *)(pTVar12 + (long)pTVar2);
    local_40 = (TCGTemp *)0x0;
    local_58 = pTVar33;
    local_50 = pTVar37;
    local_48 = ts;
    if (val->hooks_count[2] == 1) {
      for (plVar11 = val->hook[2].head; plVar11 != (list_item *)0x0; plVar11 = plVar11->next) {
        phVar4 = (hook *)plVar11->data;
        if (phVar4->to_delete == false) {
          pTVar14 = tcg_const_i64_mips64el(pTVar2,(int64_t)phVar4->user_data);
          local_40 = (TCGTemp *)(pTVar14 + (long)pTVar2);
          (*val->add_inline_hook)(val,phVar4,&local_58,4);
          tcg_temp_free_internal_mips64el(pTVar2,(TCGTemp *)(pTVar14 + (long)pTVar2));
        }
      }
    }
    else {
      pTVar12 = tcg_const_i32_mips64el(pTVar2,2);
      local_78 = ts;
      local_70 = (TCGTemp *)(pTVar12 + (long)&pTVar2->pool_cur);
      local_68 = pTVar33;
      local_60 = pTVar37;
      tcg_gen_callN_mips64el(pTVar2,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_78);
      tcg_temp_free_internal_mips64el(pTVar2,(TCGTemp *)(pTVar12 + (long)&pTVar2->pool_cur));
    }
    tcg_temp_free_internal_mips64el(pTVar2,pTVar37);
    tcg_temp_free_internal_mips64el(pTVar2,pTVar33);
    tcg_temp_free_internal_mips64el(pTVar2,ts);
    bVar5 = true;
    if (uVar34 == 0) {
      check_exit_request_mips64el(pTVar2);
    }
    goto LAB_00978f5c;
  }
LAB_00978d55:
  bVar5 = false;
  local_80 = (void *)0x0;
LAB_00978f5c:
  uVar24._0_4_ = dcbase[1].is_jmp;
  uVar24._4_4_ = dcbase[1].num_insns;
  if ((short)(undefined4)uVar24 < 0) {
    uVar6 = cpu_lduw_code_mips64el(env,dcbase->pc_next);
    *(uint *)&dcbase[1].pc_next = uVar6;
    pTVar25 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
    if ((dcbase->pc_next & 1) != 0) {
      pTVar14 = tcg_const_i64_mips64el(pTVar25,dcbase->pc_next);
      tcg_gen_op3_mips64el
                (pTVar25,INDEX_op_st_i64,(TCGArg)(pTVar14 + (long)pTVar25),
                 (TCGArg)(pTVar25->cpu_env + (long)pTVar25),0x648);
      tcg_temp_free_internal_mips64el(pTVar25,(TCGTemp *)(pTVar14 + (long)pTVar25));
      generate_exception_err((DisasContext_conflict6 *)dcbase,0xc,0);
      goto LAB_0097917b;
    }
    uVar30 = uVar6 >> 10 & 0x3f;
    if (0x3b < uVar30 - 4) {
switchD_00979046_caseD_8:
      uVar30 = decode_nanomips_32_48_opc
                         ((CPUMIPSState_conflict8 *)env,(DisasContext_conflict6 *)dcbase);
      goto LAB_0097a106;
    }
    uVar17 = uVar6 >> 7 & 7;
    uVar24 = (ulong)uVar17;
    uVar19 = *(uint *)(decode_gpr_gpr3_map + uVar24 * 4);
    uVar35 = uVar6 >> 4 & 7;
    uVar15 = *(uint *)(decode_gpr_gpr3_map + (ulong)uVar35 * 4);
    uVar7 = uVar6 >> 1;
    uVar18 = *(uint *)(decode_gpr_gpr3_map + (ulong)(uVar6 & 0xe) * 2);
    switch(uVar30) {
    case 4:
      uVar18 = uVar6 >> 5 & 0x1f;
      if (uVar18 != 0) {
        uVar15 = uVar6 & 0x1f;
        goto LAB_00979678;
      }
      switch(uVar6 >> 3 & 3) {
      case 0:
        goto switchD_009791df_caseD_29;
      case 1:
        if ((uVar6 & 4) != 0) goto switchD_009791df_caseD_29;
        iVar27 = 0x11;
        break;
      case 2:
        iVar27 = 0x12;
        break;
      case 3:
        if ((dcbase[2].pc_next & 0x400000) != 0) goto switchD_009791df_caseD_29;
        iVar27 = 0x10;
      }
LAB_0097940b:
      generate_exception_err((DisasContext_conflict6 *)dcbase,iVar27,0);
      goto LAB_00979412;
    case 5:
      uVar30 = (uVar6 & 0xf) << 2;
      break;
    case 6:
      iVar27 = (uVar6 & 0x3fe) + (uVar6 & 1) * -0x400;
      uVar9 = 0x10000000;
      goto LAB_00979726;
    case 7:
      rt = (byte)(uVar6 >> 9) & 1 | 0x1e;
      count = (byte)uVar6 & 0xf;
      uVar21 = (ushort)uVar6 & 0xf0;
      if ((uVar6 >> 8 & 1) == 0) {
        gen_save((DisasContext_conflict6 *)dcbase,rt,count,'\0',uVar21);
        goto LAB_0097a0f6;
      }
      gen_restore((DisasContext_conflict6 *)dcbase,rt,count,'\0',uVar21);
      uVar9 = 8;
      uVar15 = 0x1f;
      uVar19 = 0;
      iVar27 = 0;
      goto LAB_009798ab;
    default:
      goto switchD_00979046_caseD_8;
    case 0xc:
      uVar9 = uVar6 >> 2 & 2;
      iVar32 = 8;
      if ((uVar6 & 7) != 0) {
        iVar32 = (int16_t)(uVar6 & 7);
      }
      goto LAB_0097959a;
    case 0xd:
      uVar19 = uVar6 >> 5 & 0x1f;
      uVar30 = (uVar6 & 0x1f) << 2;
      uVar15 = 0x1d;
      break;
    case 0xe:
      iVar27 = (uVar6 & 0x3fe) + (uVar6 & 1) * -0x400;
      uVar9 = 0x4110000;
LAB_00979726:
      uVar15 = 0;
      goto LAB_009798a5;
    case 0xf:
      iVar27 = *(int *)(decode_gpr_gpr4_map + (ulong)(uVar6 >> 5 & 7 | uVar6 >> 6 & 8) * 4);
      iVar20 = *(int *)(decode_gpr_gpr4_map + (ulong)((uVar6 & 7) + (uVar6 >> 4 & 1) * 8) * 4);
      uVar6 = uVar6 >> 3 & 1 | uVar6 >> 7 & 2;
      if (uVar6 == 1) {
        if (((ulong)dcbase[2].tb & 0x20000000000000) != 0) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        gen_r6_muldiv((DisasContext_conflict6 *)dcbase,0x98,iVar27,iVar20,iVar27);
      }
      else if (uVar6 == 0) {
        if (((ulong)dcbase[2].tb & 0x20000000000000) != 0) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        gen_arith((DisasContext_conflict6 *)dcbase,0x21,iVar27,iVar20,iVar27);
      }
      else {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      goto LAB_0097af9d;
    case 0x14:
      if ((uVar6 & 1) == 0) {
        gen_pool16c_nanomips_insn((DisasContext_conflict6 *)dcbase);
      }
      else {
        gen_ldxs((DisasContext_conflict6 *)dcbase,uVar19,uVar15,uVar18);
      }
      goto LAB_0097a0f6;
    case 0x15:
      uVar30 = (uVar6 & 0x7f) << 2;
      uVar15 = 0x1c;
      break;
    case 0x17:
      uVar30 = uVar6 & 3;
      uVar18 = uVar15;
      switch(uVar6 >> 2 & 3) {
      case 0:
        uVar9 = 0x80000000;
        break;
      case 1:
        uVar19 = *(uint *)(decode_gpr_gpr3_src_store_map + uVar24 * 4);
        uVar9 = 0xa0000000;
        goto LAB_009797f0;
      case 2:
        uVar9 = 0x90000000;
        break;
      case 3:
        goto switchD_009794ea_caseD_3;
      }
      goto LAB_0097a0f1;
    case 0x1c:
      if ((uVar6 & 0x40) != 0) {
        iVar27 = (uVar6 & 0x3f) << 2;
        goto LAB_00979a10;
      }
switchD_009794ea_caseD_3:
LAB_00979649:
      iVar27 = 0x14;
      goto LAB_0097964e;
    case 0x1d:
      if (((ulong)dcbase[2].tb & 0x20000000000000) != 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        uVar6 = (uint)dcbase[1].pc_next;
        uVar7 = uVar6 >> 1;
      }
      uVar30 = uVar6 >> 6 & 4 | uVar6 & 8;
      uVar19 = *(uint *)(decode_gpr_gpr4_map + (ulong)(uVar6 >> 5 & 7 | uVar6 >> 6 & 8) * 4);
      uVar9 = 0x8c000000;
      uVar18 = *(uint *)(decode_gpr_gpr4_map + (ulong)(uVar6 & 7 | uVar7 & 8) * 4);
      goto LAB_0097a0f1;
    case 0x1f:
      (*(code *)(&DAT_00d9d830 + *(int *)(&DAT_00d9d830 + (ulong)(uVar6 & 1 | uVar6 >> 2 & 2) * 4)))
                (uVar24,&DAT_00d9d830 +
                        *(int *)(&DAT_00d9d830 + (ulong)(uVar6 & 1 | uVar6 >> 2 & 2) * 4),
                 &DAT_00d9d830,uVar15,uVar6 & 6);
      return;
    case 0x24:
      if ((uVar6 & 8) == 0) {
        iVar27 = (uVar6 & 7) << 2;
        goto LAB_0097a019;
      }
      uVar30 = 2;
      uVar15 = uVar6 >> 5 & 0x1f;
      if (uVar15 != 0) {
        gen_arith_imm((DisasContext_conflict6 *)dcbase,0x24000000,uVar15,uVar15,
                      uVar6 & 7 | (int)(uVar6 << 0x1b) >> 0x1c & 0xfffffff8U);
      }
      goto LAB_0097a106;
    case 0x25:
      uVar19 = *(uint *)(decode_gpr_gpr3_src_store_map + uVar24 * 4);
      uVar30 = (uVar6 & 0xf) << 2;
      goto LAB_009797ed;
    case 0x26:
      iVar27 = (uVar6 & 0x7e) + (uVar6 & 1) * -0x80;
      uVar9 = 0x10000000;
      uVar15 = uVar19;
      goto LAB_009798a5;
    case 0x2c:
      if ((uVar6 & 1) == 0) {
        uVar9 = 0x21;
      }
      else {
        uVar9 = 0x23;
      }
      goto LAB_00979aa0;
    case 0x2d:
      uVar19 = uVar6 >> 5 & 0x1f;
      uVar30 = (uVar6 & 0x1f) << 2;
      uVar15 = 0x1d;
      goto LAB_009797ed;
    case 0x2e:
      iVar27 = (uVar6 & 0x7e) + (uVar6 & 1) * -0x80;
      uVar9 = 0x14000000;
      uVar15 = uVar19;
LAB_009798a5:
      uVar19 = 0;
LAB_009798ab:
      uVar30 = 2;
      gen_compute_branch_nm((DisasContext_conflict6 *)dcbase,uVar9,2,uVar15,uVar19,iVar27);
      goto LAB_0097a106;
    case 0x2f:
    case 0x3f:
      if (((ulong)dcbase[2].tb & 0x20000000000000) != 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        uVar6 = (uint)dcbase[1].pc_next;
        uVar7 = uVar6 >> 1;
      }
      uVar15 = (uVar6 >> 8 & 1 | uVar6 >> 2 & 2) << 2;
      iVar27 = *(int *)(decode_nanomips_opc_gpr2reg1 + uVar15);
      iVar20 = *(int *)(decode_nanomips_opc_gpr2reg2 + uVar15);
      uVar24 = (ulong)(uVar6 & 7 | uVar7 & 8);
      uVar31 = (ulong)(uVar6 >> 5 & 7 | uVar6 >> 6 & 8);
      pTVar33 = tcg_temp_new_internal_mips64el(pTVar25,TCG_TYPE_I64,false);
      pTVar37 = tcg_temp_new_internal_mips64el(pTVar25,TCG_TYPE_I64,false);
      if (uVar30 == 0x2f) {
        iVar36 = *(int *)(decode_gpr_gpr4_zero_map + uVar24 * 4);
        iVar38 = *(int *)(decode_gpr_gpr4_zero_map + uVar31 * 4);
        local_84 = iVar27;
        iVar28 = iVar20;
      }
      else {
        local_84 = *(int *)(decode_gpr_gpr4_map + uVar24 * 4);
        iVar28 = *(int *)(decode_gpr_gpr4_map + uVar31 * 4);
        iVar36 = iVar27;
        iVar38 = iVar20;
      }
      pTVar14 = (TCGv_i64)((long)pTVar33 - (long)pTVar25);
      if (iVar36 == 0) {
        opc = INDEX_op_movi_i64;
        pTVar13 = (TCGv_i64)0x0;
LAB_00979922:
        tcg_gen_op2_mips64el(pTVar25,opc,(TCGArg)pTVar33,(TCGArg)pTVar13);
      }
      else if (pTVar25->cpu_gpr[iVar36] != pTVar14) {
        pTVar13 = (TCGv_i64)((long)&pTVar25->pool_cur + (long)pTVar25->cpu_gpr[iVar36]);
        opc = INDEX_op_mov_i64;
        goto LAB_00979922;
      }
      pTVar13 = (TCGv_i64)((long)pTVar37 - (long)pTVar25);
      if (iVar38 == 0) {
        tcg_gen_op2_mips64el(pTVar25,INDEX_op_movi_i64,(TCGArg)pTVar37,0);
      }
      else if (pTVar25->cpu_gpr[iVar38] != pTVar13) {
        tcg_gen_op2_mips64el
                  (pTVar25,INDEX_op_mov_i64,(TCGArg)pTVar37,
                   (TCGArg)((long)&pTVar25->pool_cur + (long)pTVar25->cpu_gpr[iVar38]));
      }
      if (pTVar25->cpu_gpr[local_84] != pTVar14) {
        tcg_gen_op2_mips64el
                  (pTVar25,INDEX_op_mov_i64,
                   (TCGArg)((long)&pTVar25->pool_cur + (long)pTVar25->cpu_gpr[local_84]),
                   (TCGArg)pTVar33);
      }
      if (pTVar25->cpu_gpr[iVar28] != pTVar13) {
        tcg_gen_op2_mips64el
                  (pTVar25,INDEX_op_mov_i64,
                   (TCGArg)((long)&pTVar25->pool_cur + (long)pTVar25->cpu_gpr[iVar28]),
                   (TCGArg)pTVar37);
      }
      tcg_temp_free_internal_mips64el(pTVar25,(TCGTemp *)(pTVar14 + (long)pTVar25));
      tcg_temp_free_internal_mips64el(pTVar25,(TCGTemp *)(pTVar13 + (long)pTVar25));
      goto LAB_0097a0f6;
    case 0x34:
      uVar30 = 0xffffffff;
      if ((uVar6 & 0x7f) != 0x7f) {
        uVar30 = uVar6 & 0x7f;
      }
      a2 = (TCGArg)(int)uVar30;
      pTVar14 = (TCGv_i64)((long)&pTVar25->pool_cur + (long)pTVar25->cpu_gpr[(int)uVar19]);
      goto LAB_009796f6;
    case 0x35:
      uVar19 = *(uint *)(decode_gpr_gpr3_src_store_map + uVar24 * 4);
      uVar30 = (uVar6 & 0x7f) << 2;
      uVar15 = 0x1c;
LAB_009797ed:
      uVar9 = 0xac000000;
      uVar18 = uVar15;
      goto LAB_009797f0;
    case 0x36:
      if ((uVar6 & 0xf) != 0) {
        uVar9 = (uVar17 <= uVar35 | 4) << 0x1a;
        iVar27 = (uVar6 & 0xf) * 2;
        goto LAB_009798ab;
      }
      uVar30 = 2;
      if ((uVar6 & 0x10) == 0) {
        uVar9 = 8;
        iVar27 = 0;
      }
      else {
        uVar9 = 9;
        iVar27 = 0x1f;
      }
      gen_compute_branch_nm((DisasContext_conflict6 *)dcbase,uVar9,2,uVar6 >> 5 & 0x1f,iVar27,0);
      goto LAB_0097a106;
    case 0x3c:
      uVar6 = uVar6 & 0xf;
      uVar21 = 0xffff;
      if (uVar6 != 0xd) {
        uVar21 = (ushort)uVar6;
      }
      imm = 0xff;
      if (uVar6 != 0xc) {
        imm = uVar21;
      }
      uVar9 = 0x30000000;
      goto LAB_00979524;
    case 0x3d:
      if (((ulong)dcbase[2].tb & 0x20000000000000) != 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        uVar6 = (uint)dcbase[1].pc_next;
        uVar7 = uVar6 >> 1;
      }
      uVar30 = uVar6 >> 6 & 4 | uVar6 & 8;
      uVar19 = *(uint *)(decode_gpr_gpr4_zero_map + (ulong)(uVar6 >> 5 & 7 | uVar6 >> 6 & 8) * 4);
      uVar9 = 0xac000000;
      uVar18 = *(uint *)(decode_gpr_gpr4_map + (ulong)(uVar6 & 7 | uVar7 & 8) * 4);
      goto LAB_009797f0;
    }
    uVar9 = 0x8c000000;
    uVar18 = uVar15;
    goto LAB_0097a0f1;
  }
  if ((dcbase[2].pc_next & 0x400) == 0) {
    uVar6 = cpu_ldl_code_mips64el(env,dcbase->pc_next);
    *(uint *)&dcbase[1].pc_next = uVar6;
    if ((dcbase->pc_next & 3) == 0) {
      pTVar2 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
      if ((dcbase[2].pc_next & 0x803800) == 0x1800) {
        l = gen_new_label_mips64el(pTVar2);
        tcg_gen_brcondi_i64_mips64el(pTVar2,TCG_COND_NE,pTVar2->bcond,0,l);
        tcg_gen_op2_mips64el
                  (pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->hflags + (long)pTVar2),
                   (long)(int)dcbase[2].pc_next & 0xffffffffff7807ff);
        gen_goto_tb((DisasContext_conflict6 *)dcbase,1,dcbase->pc_next + 4);
        *(byte *)l = *(byte *)l | 1;
        tcg_gen_op1_mips64el(pTVar2,INDEX_op_set_label,(TCGArg)l);
        uVar6 = (uint)dcbase[1].pc_next;
      }
      (*(code *)(&DAT_00d9db4c + *(int *)(&DAT_00d9db4c + (ulong)(uVar6 >> 0x1a ^ 0x20) * 4)))();
      return;
    }
    env->CP0_BadVAddr = dcbase->pc_next;
    generate_exception_err((DisasContext_conflict6 *)dcbase,0xc,2);
LAB_00978fa6:
    uVar30 = 4;
    goto LAB_0097a106;
  }
  if ((uVar24 >> 0x28 & 1) != 0) {
    uVar6 = cpu_lduw_code_mips64el(env,dcbase->pc_next);
    *(uint *)&dcbase[1].pc_next = uVar6;
    if ((dcbase->pc_next & 1) != 0) {
      env->CP0_BadVAddr = dcbase->pc_next;
      iVar27 = 0xc;
      goto LAB_0097940b;
    }
    pTVar25 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
    uVar30 = (uint)dcbase[2].pc_next;
    if ((uVar30 >> 0x11 & 1) != 0) {
      if ((uVar6 >> 10 & 7) - 1 < 3) {
        if ((uVar30 >> 0x10 & 1) == 0) goto LAB_009791c2;
      }
      else if (-1 < (short)uVar30) goto LAB_009791c2;
switchD_009791df_caseD_29:
      iVar27 = 0x14;
      goto LAB_0097940b;
    }
LAB_009791c2:
    uVar30 = uVar6 >> 10 & 0x3f;
    switch(uVar30) {
    case 1:
      uVar30 = *(uint *)(xlat_map + (uVar6 >> 5 & 0x1c));
      iVar27 = *(int *)(xlat_map + (uVar6 >> 2 & 0x1c));
      uVar9 = (uVar6 & 1) * 2 + 0x21;
      uVar15 = *(uint *)(xlat_map + (ulong)(uVar6 & 0xe) * 2);
      if ((dcbase[1].is_jmp & 0x2000) == DISAS_NEXT) {
        uVar15 = uVar30;
        uVar30 = *(uint *)(xlat_map + (ulong)(uVar6 & 0xe) * 2);
      }
      goto LAB_0097ac78;
    case 2:
      uVar19 = *(uint *)(xlat_map + (uVar6 >> 5 & 0x1c));
      uVar18 = *(uint *)(xlat_map + (uVar6 >> 2 & 0x1c));
      uVar30 = 0xffffffff;
      if ((uVar6 & 0xf) != 0xf) {
        uVar30 = uVar6 & 0xf;
      }
      uVar9 = 0x90000000;
      goto LAB_0097a560;
    case 3:
      uVar9 = 0x21;
      iVar27 = 0;
      uVar15 = uVar6 >> 5 & 0x1f;
      uVar30 = uVar6 & 0x1f;
LAB_0097ac78:
      gen_arith((DisasContext_conflict6 *)dcbase,uVar9,uVar15,uVar30,iVar27);
      break;
    default:
      decode_micromips32_opc((CPUMIPSState_conflict8 *)env,(DisasContext_conflict6 *)dcbase);
      goto LAB_00978fa6;
    case 9:
      uVar30 = uVar6 >> 1 & 7;
      iVar32 = 8;
      if (uVar30 != 0) {
        iVar32 = (int16_t)uVar30;
      }
      gen_shift_imm((DisasContext_conflict6 *)pTVar25,(uVar6 & 1) * 2,
                    *(int *)(xlat_map + (uVar6 >> 5 & 0x1c)),
                    *(int *)(xlat_map + (uVar6 >> 2 & 0x1c)),iVar32);
      break;
    case 10:
      uVar19 = *(uint *)(xlat_map + (uVar6 >> 5 & 0x1c));
      uVar18 = *(uint *)(xlat_map + (uVar6 >> 2 & 0x1c));
      uVar30 = uVar6 * 2 & 0x1e;
      uVar9 = 0x94000000;
      goto LAB_0097a560;
    case 0xb:
      gen_andi16((DisasContext_conflict6 *)dcbase);
      break;
    case 0x11:
      if ((dcbase[1].is_jmp & 0x2000) == DISAS_NEXT) {
        gen_pool16c_insn((DisasContext_conflict6 *)dcbase);
      }
      else {
        gen_pool16c_r6_insn((DisasContext_conflict6 *)dcbase);
      }
      break;
    case 0x12:
      uVar19 = uVar6 >> 5 & 0x1f;
      uVar30 = (uVar6 & 0x1f) << 2;
      uVar9 = 0x8c000000;
      uVar18 = 0x1d;
      goto LAB_0097a560;
    case 0x13:
      if ((uVar6 & 1) == 0) {
        gen_addius5((DisasContext_conflict6 *)dcbase);
      }
      else {
        gen_addiusp((DisasContext_conflict6 *)dcbase);
      }
      break;
    case 0x19:
      uVar19 = *(uint *)(xlat_map + (uVar6 >> 5 & 0x1c));
      uVar30 = (int)(uVar6 << 0x19) >> 0x17;
      uVar9 = 0x8c000000;
      uVar18 = 0x1c;
      goto LAB_0097a560;
    case 0x1a:
      uVar19 = *(uint *)(xlat_map + (uVar6 >> 5 & 0x1c));
      uVar18 = *(uint *)(xlat_map + (uVar6 >> 2 & 0x1c));
      uVar30 = (uVar6 & 0xf) << 2;
      uVar9 = 0x8c000000;
LAB_0097a560:
      gen_ld((DisasContext_conflict6 *)dcbase,uVar9,uVar19,uVar18,uVar30);
      break;
    case 0x1b:
      if ((uVar6 & 1) == 0) {
        gen_addiur2((DisasContext_conflict6 *)dcbase);
      }
      else {
        gen_addiur1sp((DisasContext_conflict6 *)dcbase);
      }
      break;
    case 0x21:
      if ((dcbase[1].is_jmp & 0x2000) != DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        uVar6 = (uint)dcbase[1].pc_next;
      }
      if ((uVar6 & 1) != 0) goto switchD_009791df_caseD_29;
      gen_movep(*(DisasContext_conflict6 **)(dcbase[4].pc_first + 0x2e8),uVar6 >> 7 & 7,
                uVar6 >> 4 & 7,uVar6 >> 1 & 7);
      break;
    case 0x22:
      uVar19 = *(uint *)(mmreg2_map + (uVar6 >> 5 & 0x1c));
      uVar18 = *(uint *)(xlat_map + (uVar6 >> 2 & 0x1c));
      uVar30 = uVar6 & 0xf;
      uVar9 = 0xa0000000;
      goto LAB_0097a60f;
    case 0x23:
    case 0x2b:
      uVar9 = (uVar30 == 0x2b | 4) << 0x1a;
      iVar27 = *(int *)(xlat_map + (uVar6 >> 5 & 0x1c));
      offset = (int)(uVar6 << 0x19) >> 0x18;
      DVar1 = dcbase[1].is_jmp;
      goto LAB_0097a318;
    case 0x29:
    case 0x31:
    case 0x39:
      goto switchD_009791df_caseD_29;
    case 0x2a:
      uVar19 = *(uint *)(mmreg2_map + (uVar6 >> 5 & 0x1c));
      uVar18 = *(uint *)(xlat_map + (uVar6 >> 2 & 0x1c));
      uVar30 = uVar6 * 2 & 0x1e;
      uVar9 = 0xa4000000;
      goto LAB_0097a60f;
    case 0x32:
      uVar19 = uVar6 >> 5 & 0x1f;
      uVar30 = (uVar6 & 0x1f) << 2;
      uVar9 = 0xac000000;
      uVar18 = 0x1d;
      goto LAB_0097a60f;
    case 0x33:
      offset = (int)(uVar6 << 0x16) >> 0x15;
      DVar1 = dcbase[1].is_jmp;
      uVar9 = 0x10000000;
      iVar27 = 0;
LAB_0097a318:
      uVar30 = 2;
      gen_compute_branch((DisasContext_conflict6 *)dcbase,uVar9,2,iVar27,0,offset,~DVar1 >> 0xb & 4)
      ;
      goto LAB_0097a106;
    case 0x3a:
      uVar19 = *(uint *)(mmreg2_map + (uVar6 >> 5 & 0x1c));
      uVar18 = *(uint *)(xlat_map + (uVar6 >> 2 & 0x1c));
      uVar30 = (uVar6 & 0xf) << 2;
      uVar9 = 0xac000000;
LAB_0097a60f:
      gen_st((DisasContext_conflict6 *)dcbase,uVar9,uVar19,uVar18,uVar30);
      break;
    case 0x3b:
      uVar30 = 0xffffffff;
      if ((uVar6 & 0x7f) != 0x7f) {
        uVar30 = uVar6 & 0x7f;
      }
      tcg_gen_op2_mips64el
                (pTVar25,INDEX_op_movi_i64,
                 (TCGArg)((long)&pTVar25->pool_cur +
                         (long)pTVar25->cpu_gpr[*(int *)(xlat_map + (uVar6 >> 5 & 0x1c))]),
                 (long)(int)uVar30);
    }
LAB_00979412:
    uVar30 = 2;
    goto LAB_0097a106;
  }
  if ((uVar24 >> 0x20 & 1) == 0) {
    generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    if (dcbase->is_jmp == DISAS_NORETURN) {
      return;
    }
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/translate.c"
               ,0x78fe,"ctx->base.is_jmp == DISAS_NORETURN");
  }
  uVar6 = cpu_lduw_code_mips64el(env,dcbase->pc_next);
  *(uint *)&dcbase[1].pc_next = uVar6;
  pTVar25 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
  uVar7 = uVar6 >> 2 & 7;
  uVar30 = 8;
  if (uVar7 != 0) {
    uVar30 = uVar7;
  }
  iVar32 = (int16_t)uVar30;
  uVar17 = uVar6 >> 8 & 7;
  uVar18 = *(uint *)(xlat_map + (ulong)uVar17 * 4);
  uVar35 = uVar6 >> 5 & 7;
  uVar19 = *(uint *)(xlat_map + (ulong)uVar35 * 4);
  uVar30 = uVar6 & 0x1f;
  cVar23 = (char)uVar6;
  uVar15 = uVar18;
  switch(uVar6 >> 0xb & 0x1f) {
  case 0:
    iVar27 = (uVar6 & 0xff) << 2;
    uVar19 = uVar18;
LAB_00979a10:
    uVar15 = 0x1d;
    goto LAB_0097a019;
  case 1:
    gen_addiupc((DisasContext_conflict6 *)dcbase,uVar18,(uVar6 & 0xff) << 2,0,0);
    break;
  case 2:
    iVar27 = (int)(short)(uVar6 << 5) >> 4;
    uVar30 = 2;
    iVar20 = 2;
LAB_00979df3:
    uVar9 = 0x10000000;
    uVar18 = 0;
    goto LAB_00979f60;
  case 3:
    uVar8 = cpu_lduw_code_mips64el(env,dcbase->pc_next + 2);
    uVar6 = (uint)dcbase[1].pc_next;
    uVar9 = 0x74000000;
    if ((uVar6 >> 10 & 1) == 0) {
      uVar9 = 0xc000000;
    }
    uVar30 = 4;
    gen_compute_branch((DisasContext_conflict6 *)dcbase,uVar9,4,uVar18,uVar19,
                       ((uVar6 & 0x3e0) << 0xb | uVar8 | (uVar6 & 0x1f) << 0x15) << 2,2);
    goto LAB_0097a106;
  case 4:
    uVar9 = 0x10000000;
    goto LAB_00979f58;
  case 5:
    uVar9 = 0x14000000;
LAB_00979f58:
    iVar27 = cVar23 * 2;
    uVar30 = 2;
    iVar20 = 2;
LAB_00979f60:
    uVar6 = 0;
    iVar28 = 0;
LAB_00979f63:
    gen_compute_branch((DisasContext_conflict6 *)dcbase,uVar9,iVar20,uVar18,iVar28,iVar27,uVar6);
    goto LAB_0097a106;
  case 6:
    switch(uVar6 & 3) {
    case 0:
      uVar9 = 0;
      break;
    case 1:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      gen_shift_imm(*(DisasContext_conflict6 **)(dcbase[4].pc_first + 0x2e8),0x38,uVar18,uVar19,
                    iVar32);
LAB_0097917b:
      uVar30 = 2;
      goto LAB_0097a106;
    case 2:
      gen_shift_imm((DisasContext_conflict6 *)pTVar25,2,uVar18,uVar19,iVar32);
      goto LAB_0097b99c;
    case 3:
      uVar9 = 3;
    }
    gen_shift_imm((DisasContext_conflict6 *)pTVar25,uVar9,uVar18,uVar19,iVar32);
    goto LAB_0097b99c;
  case 7:
    if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    if ((dcbase[2].pc_next & 8) == 0) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    uVar30 = uVar30 << 3;
    uVar9 = 0xdc000000;
    goto LAB_0097a560;
  case 8:
    if ((uVar6 & 0x10) == 0) {
      iVar27 = (int)(uVar6 << 0x1c) >> 0x1c;
      goto LAB_0097a019;
    }
    if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    if ((dcbase[2].pc_next & 8) == 0) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    gen_arith_imm((DisasContext_conflict6 *)dcbase,0x64000000,uVar19,uVar18,
                  (int)(uVar6 << 0x1c) >> 0x1c);
    uVar30 = 2;
    goto LAB_0097a106;
  case 9:
    iVar27 = (int)cVar23;
    uVar19 = uVar18;
LAB_0097a019:
    gen_arith_imm((DisasContext_conflict6 *)dcbase,0x24000000,uVar19,uVar15,iVar27);
    break;
  case 10:
    uVar9 = 0x28000000;
    goto LAB_00979fe0;
  case 0xb:
    uVar9 = 0x2c000000;
LAB_00979fe0:
    gen_slt_imm((DisasContext_conflict6 *)pTVar25,uVar9,0x18,uVar18,(ushort)uVar6 & 0xff);
    break;
  case 0xc:
    switch(uVar17) {
    case 0:
      uVar9 = 0x10000000;
      break;
    case 1:
      uVar9 = 0x14000000;
      break;
    case 2:
      uVar19 = 0x1f;
      goto LAB_0097a2b5;
    case 3:
      iVar27 = (int)cVar23 << 3;
      uVar19 = 0x1d;
      goto LAB_00979a10;
    case 4:
      if ((dcbase[1].is_jmp & 0x20) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        uVar6 = (uint)dcbase[1].pc_next;
      }
      iVar27 = 0x80;
      if ((uVar6 & 0xf) != 0) {
        iVar27 = (uVar6 & 0xf) * 8;
      }
      if ((char)uVar6 < '\0') {
        gen_mips16_save((DisasContext_conflict6 *)dcbase,0,0,uVar6 & 0x40,uVar6 & 0x20,uVar6 & 0x10,
                        iVar27);
      }
      else {
        gen_mips16_restore((DisasContext_conflict6 *)dcbase,0,0,uVar6 & 0x40,uVar6 & 0x20,
                           uVar6 & 0x10,iVar27);
      }
      goto LAB_0097917b;
    case 5:
      uVar15 = *(uint *)(xlat_map + (ulong)(uVar6 & 7) * 4);
      uVar18 = uVar35 | uVar6 & 0x18;
      goto LAB_00979678;
    case 6:
      goto LAB_00979649;
    case 7:
      uVar18 = uVar19;
      uVar15 = uVar30;
LAB_00979678:
      uVar9 = 0x21;
      uVar19 = 0;
LAB_00979aa0:
      gen_arith((DisasContext_conflict6 *)dcbase,uVar9,uVar18,uVar15,uVar19);
      goto LAB_0097a0f6;
    }
    iVar27 = cVar23 * 2;
    uVar30 = 2;
    iVar20 = 2;
    uVar18 = 0x18;
    goto LAB_00979f60;
  case 0xd:
    a2 = (TCGArg)(uVar6 & 0xff);
    pTVar14 = (TCGv_i64)((long)&pTVar25->pool_cur + (long)pTVar25->cpu_gpr[(int)uVar18]);
LAB_009796f6:
    tcg_gen_op2_mips64el(pTVar25,INDEX_op_movi_i64,(TCGArg)pTVar14,a2);
    break;
  case 0xe:
    imm = (ushort)uVar6 & 0xff;
    uVar9 = 0x38000000;
    uVar19 = 0x18;
LAB_00979524:
    gen_logic_imm((DisasContext_conflict6 *)dcbase,uVar9,uVar19,uVar15,imm);
    break;
  case 0xf:
    if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    if ((dcbase[2].pc_next & 8) == 0) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    uVar30 = uVar30 << 3;
    uVar9 = 0xfc000000;
    goto LAB_0097a60f;
  case 0x10:
    uVar9 = 0x80000000;
    goto LAB_0097a0f1;
  case 0x11:
    uVar30 = uVar30 * 2;
    uVar9 = 0x84000000;
    goto LAB_0097a0f1;
  case 0x12:
    uVar30 = (uVar6 & 0xff) << 2;
    uVar9 = 0x8c000000;
    uVar19 = uVar18;
    uVar18 = 0x1d;
    goto LAB_0097a0f1;
  case 0x13:
    uVar30 = uVar30 << 2;
    uVar9 = 0x8c000000;
    goto LAB_0097a0f1;
  case 0x14:
    uVar9 = 0x90000000;
    goto LAB_0097a0f1;
  case 0x15:
    uVar30 = uVar30 * 2;
    uVar9 = 0x94000000;
    goto LAB_0097a0f1;
  case 0x16:
    uVar30 = (uVar6 & 0xff) << 2;
    uVar9 = 0x8c000005;
    uVar19 = uVar18;
    uVar18 = 0;
LAB_0097a0f1:
    gen_ld((DisasContext_conflict6 *)dcbase,uVar9,uVar19,uVar18,uVar30);
    break;
  case 0x17:
    if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    if ((dcbase[2].pc_next & 8) == 0) {
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
    }
    uVar30 = uVar30 << 2;
    uVar9 = 0x9c000000;
    goto LAB_0097a560;
  case 0x18:
    uVar9 = 0xa0000000;
    goto LAB_009797f0;
  case 0x19:
    uVar30 = uVar30 * 2;
    uVar9 = 0xa4000000;
    goto LAB_009797f0;
  case 0x1a:
    uVar19 = uVar18;
LAB_0097a2b5:
    uVar30 = (uVar6 & 0xff) << 2;
    uVar9 = 0xac000000;
    uVar18 = 0x1d;
    goto LAB_009797f0;
  case 0x1b:
    uVar30 = uVar30 << 2;
    uVar9 = 0xac000000;
LAB_009797f0:
    gen_st((DisasContext_conflict6 *)dcbase,uVar9,uVar19,uVar18,uVar30);
    break;
  case 0x1c:
    iVar27 = *(int *)(xlat_map + (ulong)uVar7 * 4);
    switch(uVar6 & 3) {
    case 0:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar9 = 0x2d;
      goto LAB_0097af4b;
    case 1:
      uVar9 = 0x21;
      break;
    case 2:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar9 = 0x2f;
LAB_0097af4b:
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      break;
    case 3:
      uVar9 = 0x23;
    }
    gen_arith((DisasContext_conflict6 *)dcbase,uVar9,iVar27,uVar18,uVar19);
LAB_0097af9d:
    uVar30 = 2;
    goto LAB_0097a106;
  case 0x1d:
    uVar15 = uVar19;
    uVar7 = uVar18;
    switch(uVar30) {
    case 0:
      if (((uVar6 & 0x80) != 0) && ((dcbase[1].is_jmp & 0x20) == DISAS_NEXT)) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar9 = 9 - ((uVar6 & 0x40) == 0);
      uVar30 = 0x1f;
      if ((uVar6 & 0x20) == 0) {
        uVar30 = uVar18;
      }
      uVar18 = uVar30;
      uVar6 = (uVar6 & 0x80) >> 6 ^ 2;
      uVar30 = 2;
      iVar20 = 2;
      iVar28 = 0x1f;
      iVar27 = 0;
      goto LAB_00979f63;
    case 1:
      if ((dcbase[1].is_jmp & 0x20) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      iVar27 = 0x10;
      goto LAB_0097964e;
    case 2:
      uVar9 = 0x2a;
      goto LAB_0097b963;
    case 3:
      uVar9 = 0x2b;
LAB_0097b963:
      gen_slt((DisasContext_conflict6 *)pTVar25,uVar9,0x18,uVar18,uVar19);
      goto LAB_0097b99c;
    case 4:
      uVar9 = 4;
      goto LAB_0097b977;
    case 5:
      iVar27 = 0x12;
LAB_0097964e:
      generate_exception_err((DisasContext_conflict6 *)dcbase,iVar27,0);
      goto LAB_0097a0f6;
    case 6:
      uVar9 = 6;
      goto LAB_0097b977;
    case 7:
      uVar9 = 7;
LAB_0097b977:
      gen_shift((DisasContext_conflict6 *)pTVar25,uVar9,uVar19,uVar18,uVar19);
      goto LAB_0097b99c;
    case 8:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      pTVar25 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
      uVar9 = 0x3a;
      goto LAB_0097959a;
    default:
switchD_0097a23c_caseD_9:
      goto LAB_00979649;
    case 10:
      uVar9 = 0x26;
      uVar7 = 0x18;
      goto LAB_0097b991;
    case 0xb:
      uVar9 = 0x23;
      uVar15 = 0;
      goto LAB_00979aa0;
    case 0xc:
      uVar9 = 0x24;
      goto LAB_0097b991;
    case 0xd:
      uVar9 = 0x25;
      goto LAB_0097b991;
    case 0xe:
      uVar9 = 0x26;
      goto LAB_0097b991;
    case 0xf:
      uVar9 = 0x27;
      uVar15 = 0;
      uVar18 = uVar19;
LAB_0097b991:
      gen_logic((DisasContext_conflict6 *)pTVar25,uVar9,uVar7,uVar18,uVar15);
LAB_0097b99c:
      uVar30 = 2;
      goto LAB_0097a106;
    case 0x10:
      uVar9 = 0x10;
      goto LAB_0097b9ea;
    case 0x11:
      if ((dcbase[1].is_jmp & 0x20) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      switch(uVar35) {
      case 0:
        tcg_gen_ext8u_i64_mips64el
                  (pTVar25,pTVar25->cpu_gpr[(int)uVar18],pTVar25->cpu_gpr[(int)uVar18]);
        break;
      case 1:
        tcg_gen_ext16u_i64_mips64el
                  (pTVar25,pTVar25->cpu_gpr[(int)uVar18],pTVar25->cpu_gpr[(int)uVar18]);
        break;
      case 2:
        if ((dcbase[1].is_jmp & 0x80) == DISAS_NEXT) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        if ((dcbase[2].pc_next & 8) == 0) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        tcg_gen_ext32u_i64_mips64el
                  (pTVar25,pTVar25->cpu_gpr[(int)uVar18],pTVar25->cpu_gpr[(int)uVar18]);
        break;
      default:
        goto switchD_0097a23c_caseD_9;
      case 4:
        tcg_gen_ext8s_i64_mips64el
                  (pTVar25,pTVar25->cpu_gpr[(int)uVar18],pTVar25->cpu_gpr[(int)uVar18]);
        break;
      case 5:
        tcg_gen_ext16s_i64_mips64el
                  (pTVar25,pTVar25->cpu_gpr[(int)uVar18],pTVar25->cpu_gpr[(int)uVar18]);
        break;
      case 6:
        if ((dcbase[1].is_jmp & 0x80) == DISAS_NEXT) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        if ((dcbase[2].pc_next & 8) == 0) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        tcg_gen_ext32s_i64_mips64el
                  (pTVar25,pTVar25->cpu_gpr[(int)uVar18],pTVar25->cpu_gpr[(int)uVar18]);
      }
      goto LAB_0097b99c;
    case 0x12:
      uVar9 = 0x12;
LAB_0097b9ea:
      gen_HILO((DisasContext_conflict6 *)dcbase,uVar9,0,uVar18);
      goto LAB_0097a0f6;
    case 0x13:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      pTVar25 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
      uVar9 = 0x3b;
LAB_0097959a:
      gen_shift_imm((DisasContext_conflict6 *)pTVar25,uVar9,uVar19,uVar15,iVar32);
      goto LAB_0097a0f6;
    case 0x14:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      pDVar26 = *(DisasContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
      uVar9 = 0x14;
      goto LAB_0097ba75;
    case 0x16:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      pDVar26 = *(DisasContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
      uVar9 = 0x16;
      goto LAB_0097ba75;
    case 0x17:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      pDVar26 = *(DisasContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
      uVar9 = 0x17;
LAB_0097ba75:
      gen_shift(pDVar26,uVar9,uVar19,uVar18,uVar19);
      goto LAB_0097a0f6;
    case 0x18:
      uVar9 = 0x18;
      break;
    case 0x19:
      uVar9 = 0x19;
      break;
    case 0x1a:
      uVar9 = 0x1a;
      break;
    case 0x1b:
      uVar9 = 0x1b;
      break;
    case 0x1c:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar9 = 0x1c;
      break;
    case 0x1d:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar9 = 0x1d;
      break;
    case 0x1e:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar9 = 0x1e;
      break;
    case 0x1f:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar9 = 0x1f;
    }
    gen_muldiv((DisasContext_conflict6 *)dcbase,uVar9,0,uVar18,uVar19);
    break;
  case 0x1e:
    uVar9 = cpu_lduw_code_mips64el(env,dcbase->pc_next + 2);
    uVar6 = (int)dcbase[1].pc_next << 0x10 | uVar9;
    *(uint *)&dcbase[1].pc_next = uVar6;
    uVar30 = uVar9 >> 0xb & 0x1f;
    if (0x1f < uVar30) {
switchD_0097a0a1_caseD_3:
      generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      goto LAB_0097c241;
    }
    uVar19 = uVar9 >> 8 & 7;
    uVar18 = *(uint *)(xlat_map + (ulong)uVar19 * 4);
    uVar15 = *(uint *)(xlat_map + (uVar9 >> 3 & 0x1c));
    uVar35 = uVar6 >> 0x10;
    uVar17 = uVar35 << 0xb;
    uVar29 = uVar35 & 0x7e0;
    uVar7 = uVar9 & 0x1f;
    uVar21 = (ushort)uVar7 | (ushort)uVar29 | (ushort)uVar17;
    switch(uVar30) {
    case 0:
LAB_0097a0b5:
      iVar27 = (int)(short)uVar21;
      uVar9 = 0x24000000;
      uVar15 = uVar18;
      uVar18 = 0x1d;
      goto LAB_0097bd67;
    case 1:
      gen_addiupc((DisasContext_conflict6 *)dcbase,uVar18,(int)(short)uVar21,0,1);
      goto LAB_0097c241;
    case 2:
      iVar27 = (short)uVar21 * 2;
      uVar30 = 4;
      iVar20 = 4;
      goto LAB_00979df3;
    default:
      goto switchD_0097a0a1_caseD_3;
    case 4:
      uVar9 = 0x10000000;
      goto LAB_0097b5bb;
    case 5:
      uVar9 = 0x14000000;
LAB_0097b5bb:
      iVar27 = (short)uVar21 * 2;
      uVar30 = 4;
      iVar20 = 4;
      goto LAB_00979f60;
    case 6:
      switch(uVar9 & 3) {
      case 0:
        pDVar26 = *(DisasContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
        uVar9 = 0;
        break;
      case 1:
        if ((dcbase[2].pc_next & 8) == 0) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        pDVar26 = *(DisasContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
        uVar9 = 0x38;
        break;
      case 2:
        pDVar26 = *(DisasContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
        uVar9 = 2;
        break;
      case 3:
        pDVar26 = *(DisasContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
        uVar9 = 3;
      }
      gen_shift_imm(pDVar26,uVar9,uVar18,uVar15,(ushort)(uVar6 >> 0x16) & 0x1f);
      goto LAB_0097c241;
    case 7:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar9 = 0xdc000000;
      break;
    case 8:
      iVar27 = (int)((uVar35 & 0x7f0 | uVar9 & 0xf) << 0x11 | uVar35 << 0x1c) >> 0x11;
      if ((uVar9 & 0x10) == 0) {
        uVar9 = 0x24000000;
      }
      else {
        if ((dcbase[2].pc_next & 8) == 0) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
        }
        uVar9 = 0x64000000;
      }
      goto LAB_0097bd67;
    case 9:
      iVar27 = (int)(short)uVar21;
      uVar9 = 0x24000000;
      uVar15 = uVar18;
LAB_0097bd67:
      gen_arith_imm((DisasContext_conflict6 *)dcbase,uVar9,uVar15,uVar18,iVar27);
      goto LAB_0097c241;
    case 10:
      pDVar26 = *(DisasContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
      uVar9 = 0x28000000;
      goto LAB_0097b6f4;
    case 0xb:
      pDVar26 = *(DisasContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
      uVar9 = 0x2c000000;
LAB_0097b6f4:
      gen_slt_imm(pDVar26,uVar9,0x18,uVar18,uVar21);
      goto LAB_0097c241;
    case 0xc:
      switch((ulong)uVar19) {
      case 0:
        uVar9 = 0x10000000;
        break;
      case 1:
        uVar9 = 0x14000000;
        break;
      case 2:
        uVar18 = 0x1f;
        goto LAB_0097b45d;
      case 3:
        uVar18 = 0x1d;
        goto LAB_0097a0b5;
      case 4:
        if ((dcbase[1].is_jmp & 0x20) == DISAS_NEXT) {
          generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
          uVar6 = (uint)dcbase[1].pc_next;
          uVar35 = uVar6 >> 0x10;
        }
        uVar15 = uVar6 >> 0x18 & 7;
        uVar30 = uVar6 >> 6 & 1;
        uVar19 = uVar6 >> 5 & 1;
        uVar18 = uVar6 >> 4 & 1;
        iVar27 = (uVar6 & 0xf | uVar35 & 0xf0) << 3;
        if ((char)uVar6 < '\0') {
          gen_mips16_save((DisasContext_conflict6 *)dcbase,uVar15,uVar35 & 0xf,uVar30,uVar19,uVar18,
                          iVar27);
        }
        else {
          gen_mips16_restore((DisasContext_conflict6 *)dcbase,uVar15,uVar35 & 0xf,uVar30,uVar19,
                             uVar18,iVar27);
        }
        goto LAB_0097c241;
      default:
        goto switchD_0097a0a1_caseD_3;
      }
      gen_compute_branch((DisasContext_conflict6 *)dcbase,uVar9,4,0x18,0,(short)uVar21 * 2,0);
      goto LAB_0097c241;
    case 0xd:
      tcg_gen_op2_mips64el
                (pTVar25,INDEX_op_movi_i64,
                 (TCGArg)((long)&pTVar25->pool_cur + (long)pTVar25->cpu_gpr[(int)uVar18]),
                 (ulong)(uVar7 | uVar29 | uVar17 & 0xffff));
      goto LAB_0097b72f;
    case 0xe:
      tcg_gen_xori_i64_mips64el
                (pTVar25,pTVar25->cpu_gpr[0x18],pTVar25->cpu_gpr[(int)uVar18],
                 (ulong)(uVar7 | uVar29 | uVar17 & 0xffff));
LAB_0097b72f:
      uVar30 = 4;
      goto LAB_0097a106;
    case 0xf:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar9 = 0xfc000000;
      goto LAB_0097b78a;
    case 0x10:
      uVar9 = 0x80000000;
      break;
    case 0x11:
      uVar9 = 0x84000000;
      break;
    case 0x12:
      uVar9 = 0x8c000000;
      uVar15 = uVar18;
      uVar18 = 0x1d;
      break;
    case 0x13:
      uVar9 = 0x8c000000;
      break;
    case 0x14:
      uVar9 = 0x90000000;
      break;
    case 0x15:
      uVar9 = 0x94000000;
      break;
    case 0x16:
      uVar9 = 0x8c000005;
      uVar15 = uVar18;
      uVar18 = 0;
      break;
    case 0x17:
      if ((dcbase[1].is_jmp & DISAS_TARGET_1) == DISAS_NEXT) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      if ((dcbase[2].pc_next & 8) == 0) {
        generate_exception_err((DisasContext_conflict6 *)dcbase,0x14,0);
      }
      uVar9 = 0x9c000000;
      break;
    case 0x18:
      uVar9 = 0xa0000000;
      goto LAB_0097b78a;
    case 0x19:
      uVar9 = 0xa4000000;
      goto LAB_0097b78a;
    case 0x1a:
LAB_0097b45d:
      uVar9 = 0xac000000;
      uVar15 = uVar18;
      uVar18 = 0x1d;
      goto LAB_0097b78a;
    case 0x1b:
      uVar9 = 0xac000000;
LAB_0097b78a:
      gen_st((DisasContext_conflict6 *)dcbase,uVar9,uVar15,uVar18,(int)(short)uVar21);
      goto LAB_0097c241;
    case 0x1f:
      decode_i64_mips16((DisasContext_conflict6 *)dcbase,uVar15,uVar19,uVar21,1);
      goto LAB_0097c241;
    }
    gen_ld((DisasContext_conflict6 *)dcbase,uVar9,uVar15,uVar18,(int)(short)uVar21);
LAB_0097c241:
    uVar30 = 4;
    goto LAB_0097a106;
  case 0x1f:
    decode_i64_mips16((DisasContext_conflict6 *)dcbase,uVar19,uVar17,(int16_t)uVar30,0);
  }
LAB_0097a0f6:
  uVar30 = 2;
LAB_0097a106:
  if (bVar5) {
    paVar16 = &pTVar2->ops;
    if (local_80 != (void *)0x0) {
      paVar16 = (anon_union_16_2_88bb8dd4_for_ops_free_ops *)((long)local_80 + 8);
    }
    paVar16->tqh_first->args[1] = (ulong)uVar30;
  }
  uVar6 = (uint)dcbase[2].pc_next;
  if ((uVar6 & 0x87f800) == 0) {
LAB_0097a152:
    if (uVar34 == 0) goto LAB_0097a162;
  }
  else {
    if ((uVar6 & 0x818000) == 0) {
      uVar34 = 1;
    }
    if ((~uVar6 & 0x800400) != 0) goto LAB_0097a152;
  }
  gen_branch((DisasContext_conflict6 *)dcbase,uVar30);
LAB_0097a162:
  tVar22 = (ulong)uVar30 + dcbase->pc_next;
  dcbase->pc_next = tVar22;
  if (dcbase->is_jmp == DISAS_NEXT) {
    if ((dcbase->singlestep_enabled == true) && ((dcbase[2].pc_next & 0x87f800) == 0)) {
      dcbase->is_jmp = DISAS_TOO_MANY;
    }
    if (0xfff < tVar22 - dcbase[1].pc_first) {
      dcbase->is_jmp = DISAS_TOO_MANY;
    }
  }
  return;
LAB_00978d4d:
  plVar11 = plVar11->next;
  if (plVar11 == (list_item *)0x0) goto LAB_00978d55;
  goto LAB_00978d1a;
}

Assistant:

static void mips_tr_translate_insn(DisasContextBase *dcbase, CPUState *cs)
{
    CPUMIPSState *env = cs->env_ptr;
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = cs->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    TCGOp *tcg_op, *prev_op = NULL;
    int insn_bytes;
    int is_slot;
    bool hook_insn = false;

    is_slot = ctx->hflags & MIPS_HFLAG_BMASK;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, ctx->base.pc_next)) {
        // raise a special interrupt to quit
        gen_helper_wait(tcg_ctx, tcg_ctx->cpu_env);
        ctx->base.is_jmp = DISAS_NORETURN;
        return;
    }

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, ctx->base.pc_next)) {

        // Sync PC in advance
        gen_save_pc(tcg_ctx, ctx->base.pc_next);

        // save the last operand
        prev_op = tcg_last_op(tcg_ctx);
        hook_insn = true;
        gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, uc, ctx->base.pc_next);
        // Don't let unicorn stop at the branch delay slot.
        if (!is_slot) {
            // the callback might want to stop emulation immediately
            check_exit_request(tcg_ctx);
        }
    }
    
    if (ctx->insn_flags & ISA_NANOMIPS32) {
        ctx->opcode = cpu_lduw_code(env, ctx->base.pc_next);
        insn_bytes = decode_nanomips_opc(env, ctx);
    } else if (!(ctx->hflags & MIPS_HFLAG_M16)) {
        ctx->opcode = cpu_ldl_code(env, ctx->base.pc_next);
        insn_bytes = 4;
        decode_opc(env, ctx);
    } else if (ctx->insn_flags & ASE_MICROMIPS) {
        ctx->opcode = cpu_lduw_code(env, ctx->base.pc_next);
        insn_bytes = decode_micromips_opc(env, ctx);
    } else if (ctx->insn_flags & ASE_MIPS16) {
        ctx->opcode = cpu_lduw_code(env, ctx->base.pc_next);
        insn_bytes = decode_mips16_opc(env, ctx);
    } else {
        generate_exception_end(ctx, EXCP_RI);
        g_assert(ctx->base.is_jmp == DISAS_NORETURN);
        return;
    }

    if (hook_insn) {
        // Unicorn: patch the callback to have the proper instruction size.
        if (prev_op) {
            // As explained further up in the function where prev_op is
            // assigned, we move forward in the tail queue, so we're modifying the
            // move instruction generated by gen_uc_tracecode() that contains
            // the instruction size to assign the proper size (replacing 0xF1F1F1F1).
            tcg_op = QTAILQ_NEXT(prev_op, link);
        } else {
            // this instruction is the first emulated code ever,
            // so the instruction operand is the first operand
            tcg_op = QTAILQ_FIRST(&tcg_ctx->ops);
        }

        tcg_op->args[1] = insn_bytes;
    }

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
        if (!(ctx->hflags & (MIPS_HFLAG_BDS16 | MIPS_HFLAG_BDS32 |
                             MIPS_HFLAG_FBNSLOT))) {
            /*
             * Force to generate branch as there is neither delay nor
             * forbidden slot.
             */
            is_slot = 1;
        }
        if ((ctx->hflags & MIPS_HFLAG_M16) &&
            (ctx->hflags & MIPS_HFLAG_FBNSLOT)) {
            /*
             * Force to generate branch as microMIPS R6 doesn't restrict
             * branches in the forbidden slot.
             */
            is_slot = 1;
        }
    }
    if (is_slot) {
        gen_branch(ctx, insn_bytes);
    }
    ctx->base.pc_next += insn_bytes;

    if (ctx->base.is_jmp != DISAS_NEXT) {
        return;
    }
    /*
     * Execute a branch and its delay slot as a single instruction.
     * This is what GDB expects and is consistent with what the
     * hardware does (e.g. if a delay slot instruction faults, the
     * reported PC is the PC of the branch).
     */
    if (ctx->base.singlestep_enabled &&
        (ctx->hflags & MIPS_HFLAG_BMASK) == 0) {
        ctx->base.is_jmp = DISAS_TOO_MANY;
    }
    if (ctx->base.pc_next - ctx->page_start >= TARGET_PAGE_SIZE) {
        ctx->base.is_jmp = DISAS_TOO_MANY;
    }
}